

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O1

char __thiscall CompoundFile::Stream::getByte(Stream *this)

{
  int iVar1;
  pointer pcVar2;
  char cVar3;
  
  cVar3 = -1;
  if (this->m_bytesReaded <= this->m_streamSize) {
    if (this->m_sectorBytesReaded == this->m_sectorSize) {
      this->m_sectorBytesReaded = 0;
      seekToNextSector(this);
    }
    iVar1 = this->m_pos;
    pcVar2 = (this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar2) <= (ulong)(long)iVar1) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    cVar3 = pcVar2[iVar1];
    this->m_sectorBytesReaded = this->m_sectorBytesReaded + 1;
    this->m_bytesReaded = this->m_bytesReaded + 1;
    this->m_pos = iVar1 + 1;
  }
  return cVar3;
}

Assistant:

inline char
Stream::getByte()
{
	if( m_bytesReaded > m_streamSize )
		return 0xFFu;

	if( m_sectorBytesReaded == m_sectorSize )
	{
		m_sectorBytesReaded = 0;

		seekToNextSector();
	}

	const auto ch = m_buf.at( m_pos );

	++m_sectorBytesReaded;
	++m_bytesReaded;
	++m_pos;

	return ch;
}